

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void __thiscall argsman_tests::util_GetChainTypeString::test_method(util_GetChainTypeString *this)

{
  long lVar1;
  string str_config;
  string str_config_00;
  string str_config_01;
  string str_config_02;
  string str_config_03;
  string str_config_04;
  string str_config_05;
  string str_config_06;
  string str_config_07;
  string str_config_08;
  long lVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  string *psVar5;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  undefined4 uVar6;
  undefined4 uVar7;
  check_type cVar10;
  char *pcVar8;
  char *pcVar9;
  undefined8 in_stack_fffffffffffff230;
  char *local_d88;
  char *local_d80;
  undefined1 *local_d78;
  undefined1 *local_d70;
  char *local_d68;
  char *local_d60;
  undefined1 *local_d58;
  undefined1 *local_d50;
  char *local_d48;
  char *local_d40;
  char *local_d38;
  char *local_d30;
  undefined1 *local_d28;
  undefined1 *local_d20;
  char *local_d18;
  char *local_d10;
  char *local_d08;
  char *local_d00;
  undefined1 *local_cf8;
  undefined1 *local_cf0;
  char *local_ce8;
  char *local_ce0;
  char *local_cd8;
  char *local_cd0;
  undefined1 *local_cc8;
  undefined1 *local_cc0;
  char *local_cb8;
  char *local_cb0;
  char *local_c78;
  char *local_c70;
  undefined1 *local_c68;
  undefined1 *local_c60;
  char *local_c58;
  char *local_c50;
  undefined1 *local_c48;
  undefined1 *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  char *local_c20;
  undefined1 *local_c18;
  undefined1 *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  char *local_bf0;
  undefined1 *local_be8;
  undefined1 *local_be0;
  char *local_bd8;
  char *local_bd0;
  char *local_bc8;
  char *local_bc0;
  undefined1 *local_bb8;
  undefined1 *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  char *local_b90;
  undefined1 *local_b88;
  undefined1 *local_b80;
  char *local_b78;
  char *local_b70;
  char *local_b68;
  char *local_b60;
  undefined1 *local_b58;
  undefined1 *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b08;
  char *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  char *local_ae8;
  char *local_ae0;
  undefined1 *local_ad8;
  undefined1 *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  char *local_ab0;
  undefined1 *local_aa8;
  undefined1 *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  undefined1 *local_a78;
  undefined1 *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  undefined1 *local_a48;
  undefined1 *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_9f8;
  char *local_9f0;
  undefined1 *local_9e8;
  undefined1 *local_9e0;
  char *local_9d8;
  char *local_9d0;
  undefined1 *local_9c8;
  undefined1 *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  undefined1 *local_998;
  undefined1 *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  undefined1 *local_968;
  undefined1 *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  undefined1 *local_938;
  undefined1 *local_930;
  char *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  undefined1 *local_908;
  undefined1 *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_888;
  char *local_880;
  undefined1 *local_878;
  undefined1 *local_870;
  char *local_868;
  char *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  pair<const_char_*,_ArgsManager::Flags> local_5b8;
  pair<const_char_*,_ArgsManager::Flags> local_5a8;
  pair<const_char_*,_ArgsManager::Flags> local_598;
  string local_588;
  string local_568 [32];
  string local_548 [32];
  string local_528;
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8;
  string local_488 [32];
  string local_468 [32];
  string local_448;
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8;
  string local_3a8;
  undefined1 local_388 [16];
  undefined1 *local_378;
  char *local_370;
  char *argv_both [3];
  char *argv_test_no_reg [3];
  char *argv_regtest [2];
  char *argv_testnet4 [2];
  char *argv_testnet [2];
  string error;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2a8;
  TestArgsManager test_args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager(&test_args);
  local_598.first = "-testnet";
  local_5b8.second = ALLOW_ANY;
  local_5a8.first = "-testnet4";
  local_5b8.first = "-regtest";
  local_5a8.second = local_5b8.second;
  local_598.second = local_5b8.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)&error,&local_598);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_2d0,&local_5a8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_2a8,&local_5b8);
  __l._M_len = 3;
  __l._M_array = (iterator)&error;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)local_388,__l,(allocator_type *)&local_3a8);
  TestArgsManager::SetupArgs
            (&test_args,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)local_388);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_388);
  lVar2 = 0x50;
  do {
    std::__cxx11::string::~string((string *)((long)&error._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  argv_testnet[0] = "cmd";
  argv_testnet[1] = "-testnet";
  argv_testnet4[0] = "cmd";
  argv_testnet4[1] = "-testnet4";
  argv_regtest[0] = "cmd";
  argv_regtest[1] = "-regtest";
  argv_test_no_reg[2] = "-noregtest";
  argv_test_no_reg[0] = "cmd";
  argv_test_no_reg[1] = "-testnet";
  argv_both[2] = "-regtest";
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  argv_both[0] = "cmd";
  argv_both[1] = "-testnet";
  error.field_2._M_local_buf[0] = '\0';
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x296;
  file.m_begin = (iterator)&local_5c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_5d8,msg);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,0,argv_testnet,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_370 = (char *)&local_5e8;
  local_5e8 = "test_args.ParseParameters(0, argv_testnet, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_5f0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,_cVar10,
             (size_t)&local_5f8,0x296);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x297;
  file_00.m_begin = (iterator)&local_608;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_618,
             msg_00);
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_01139f30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_620 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  pcVar8 = "main";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_3a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_388,&local_628,0x297,1,2,psVar5,0xb54254,"main","\"main\"");
  std::__cxx11::string::~string((string *)&local_3a8);
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_630 = "";
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)psVar5;
  msg_01.m_begin = pvVar3;
  file_01.m_end = (iterator)0x299;
  file_01.m_begin = (iterator)&local_638;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_648,
             msg_01);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_testnet,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(2, argv_testnet, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_650 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_658,0x299);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_660 = "";
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  file_02.m_end = (iterator)0x29a;
  file_02.m_begin = (iterator)&local_668;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_678,
             msg_02);
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_01139f30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_680 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  pcVar8 = "test";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_3a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_388,&local_688,0x29a,1,2,psVar5,0xb54254,"test","\"test\"");
  std::__cxx11::string::~string((string *)&local_3a8);
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_690 = "";
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)psVar5;
  msg_03.m_begin = pvVar3;
  file_03.m_end = (iterator)0x29c;
  file_03.m_begin = (iterator)&local_698;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_6a8,
             msg_03);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,0,argv_testnet4,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(0, argv_testnet4, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_6b0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_6b8,0x29c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_6c0 = "";
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  file_04.m_end = (iterator)0x29d;
  file_04.m_begin = (iterator)&local_6c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_6d8,
             msg_04);
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_01139f30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_6e0 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  pcVar8 = "main";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_3a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_388,&local_6e8,0x29d,1,2,psVar5,0xb54254,"main","\"main\"");
  std::__cxx11::string::~string((string *)&local_3a8);
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_6f0 = "";
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)psVar5;
  msg_05.m_begin = pvVar3;
  file_05.m_end = (iterator)0x29f;
  file_05.m_begin = (iterator)&local_6f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_708,
             msg_05);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_testnet4,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(2, argv_testnet4, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_718 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_710 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_718,0x29f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  file_06.m_end = (iterator)0x2a0;
  file_06.m_begin = (iterator)&local_728;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_738,
             msg_06);
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_01139f30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_740 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  pcVar8 = "testnet4";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_3a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
            (local_388,&local_748,0x2a0,1,2,psVar5,0xb54254,"testnet4","\"testnet4\"");
  std::__cxx11::string::~string((string *)&local_3a8);
  local_758 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_750 = "";
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)psVar5;
  msg_07.m_begin = pvVar3;
  file_07.m_end = (iterator)0x2a2;
  file_07.m_begin = (iterator)&local_758;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_768,
             msg_07);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_regtest,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(2, argv_regtest, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_778 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_770 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_778,0x2a2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  file_08.m_end = (iterator)0x2a3;
  file_08.m_begin = (iterator)&local_788;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_798,
             msg_08);
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_01139f30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_7a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_7a0 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  pcVar8 = "regtest";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_3a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
            (local_388,&local_7a8,0x2a3,1,2,psVar5,0xb54254,"regtest","\"regtest\"");
  std::__cxx11::string::~string((string *)&local_3a8);
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_7b0 = "";
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)psVar5;
  msg_09.m_begin = pvVar3;
  file_09.m_end = (iterator)0x2a5;
  file_09.m_begin = (iterator)&local_7b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_7c8,
             msg_09);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,3,argv_test_no_reg,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(3, argv_test_no_reg, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_7d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_7d0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_7d8,0x2a5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  local_7e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  file_10.m_end = (iterator)0x2a6;
  file_10.m_begin = (iterator)&local_7e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_7f8,
             msg_10);
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_01139f30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_808 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_800 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  pcVar9 = "\"test\"";
  pcVar8 = "test";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_3a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_388,&local_808,0x2a6,1,2,psVar5,0xb54254);
  std::__cxx11::string::~string((string *)&local_3a8);
  local_818 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_810 = "";
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)psVar5;
  msg_11.m_begin = pvVar3;
  file_11.m_end = (iterator)0x2a8;
  file_11.m_begin = (iterator)&local_818;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_828,
             msg_11);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,3,argv_both,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(3, argv_both, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_838 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_830 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_838,0x2a8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  local_848 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_840 = "";
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  file_12.m_end = (iterator)0x2a9;
  file_12.m_begin = (iterator)&local_848;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_858,
             msg_12);
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3c8,&test_args.super_ArgsManager);
  std::__cxx11::string::~string((string *)&local_3c8);
  local_868 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_860 = "";
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  file_13.m_end = (iterator)0x2a9;
  file_13.m_begin = (iterator)&local_868;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_878,
             msg_13);
  local_3a8._M_dataplus._M_p._0_1_ = 0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a848;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "exception std::runtime_error expected but not raised";
  local_888 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_880 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,1,WARN,(check_type)pcVar8,
             (size_t)&local_888,0x2a9);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  local_8c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_8c0 = "";
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  file_14.m_end = (iterator)0x2ab;
  file_14.m_begin = (iterator)&local_8c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_8d8,
             msg_14);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,0,argv_testnet,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(0, argv_testnet, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_8e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_8e0 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_8e8,0x2ab);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3e8,"testnet=1\nregtest=0\n[test]\nregtest=1",(allocator<char> *)local_388);
  str_config._M_dataplus._M_p._4_4_ = uVar7;
  str_config._M_dataplus._M_p._0_4_ = uVar6;
  str_config._M_string_length = (size_type)pcVar8;
  str_config.field_2._M_allocated_capacity = (size_type)pcVar9;
  str_config.field_2._8_8_ = in_stack_fffffffffffff230;
  TestArgsManager::ReadConfigString(&test_args,str_config);
  std::__cxx11::string::~string(local_3e8);
  local_8f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_8f0 = "";
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  file_15.m_end = (iterator)0x2ad;
  file_15.m_begin = (iterator)&local_8f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_908,
             msg_15);
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_01139f30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_918 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_910 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  pcVar9 = "\"test\"";
  pcVar8 = "test";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_3a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_388,&local_918,0x2ad,1,2,psVar5,0xb54254);
  std::__cxx11::string::~string((string *)&local_3a8);
  local_928 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_920 = "";
  local_938 = &boost::unit_test::basic_cstring<char_const>::null;
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = (iterator)psVar5;
  msg_16.m_begin = pvVar3;
  file_16.m_end = (iterator)0x2af;
  file_16.m_begin = (iterator)&local_928;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_938,
             msg_16);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_testnet,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(2, argv_testnet, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_948 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_940 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_948,0x2af);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            (local_408,"testnet=1\nregtest=0\n[test]\nregtest=1",(allocator<char> *)local_388);
  str_config_00._M_dataplus._M_p._4_4_ = uVar7;
  str_config_00._M_dataplus._M_p._0_4_ = uVar6;
  str_config_00._M_string_length = (size_type)pcVar8;
  str_config_00.field_2._M_allocated_capacity = (size_type)pcVar9;
  str_config_00.field_2._8_8_ = in_stack_fffffffffffff230;
  TestArgsManager::ReadConfigString(&test_args,str_config_00);
  std::__cxx11::string::~string(local_408);
  local_958 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_950 = "";
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  local_960 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar4;
  msg_17.m_begin = pvVar3;
  file_17.m_end = (iterator)0x2b1;
  file_17.m_begin = (iterator)&local_958;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_968,
             msg_17);
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_01139f30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_978 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_970 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  pcVar9 = "\"test\"";
  pcVar8 = "test";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_3a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_388,&local_978,0x2b1,1,2,psVar5,0xb54254);
  std::__cxx11::string::~string((string *)&local_3a8);
  local_988 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_980 = "";
  local_998 = &boost::unit_test::basic_cstring<char_const>::null;
  local_990 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = (iterator)psVar5;
  msg_18.m_begin = pvVar3;
  file_18.m_end = (iterator)0x2b3;
  file_18.m_begin = (iterator)&local_988;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_998,
             msg_18);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_regtest,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(2, argv_regtest, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_9a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_9a0 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_9a8,0x2b3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            (local_428,"testnet=1\nregtest=0\n[test]\nregtest=1",(allocator<char> *)local_388);
  str_config_01._M_dataplus._M_p._4_4_ = uVar7;
  str_config_01._M_dataplus._M_p._0_4_ = uVar6;
  str_config_01._M_string_length = (size_type)pcVar8;
  str_config_01.field_2._M_allocated_capacity = (size_type)pcVar9;
  str_config_01.field_2._8_8_ = in_stack_fffffffffffff230;
  TestArgsManager::ReadConfigString(&test_args,str_config_01);
  std::__cxx11::string::~string(local_428);
  local_9b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_9b0 = "";
  local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar4;
  msg_19.m_begin = pvVar3;
  file_19.m_end = (iterator)0x2b5;
  file_19.m_begin = (iterator)&local_9b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_9c8,
             msg_19);
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_448,&test_args.super_ArgsManager);
  std::__cxx11::string::~string((string *)&local_448);
  local_9d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_9d0 = "";
  local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar4;
  msg_20.m_begin = pvVar3;
  file_20.m_end = (iterator)0x2b5;
  file_20.m_begin = (iterator)&local_9d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_9e8,
             msg_20);
  local_3a8._M_dataplus._M_p._0_1_ = 0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a848;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "exception std::runtime_error expected but not raised";
  local_9f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_9f0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,1,WARN,(check_type)pcVar8,
             (size_t)&local_9f8,0x2b5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  local_a38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_a30 = "";
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = pvVar4;
  msg_21.m_begin = pvVar3;
  file_21.m_end = (iterator)0x2b7;
  file_21.m_begin = (iterator)&local_a38;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_a48,
             msg_21);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,3,argv_test_no_reg,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(3, argv_test_no_reg, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_a58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_a50 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_a58,0x2b7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            (local_468,"testnet=1\nregtest=0\n[test]\nregtest=1",(allocator<char> *)local_388);
  str_config_02._M_dataplus._M_p._4_4_ = uVar7;
  str_config_02._M_dataplus._M_p._0_4_ = uVar6;
  str_config_02._M_string_length = (size_type)pcVar8;
  str_config_02.field_2._M_allocated_capacity = (size_type)pcVar9;
  str_config_02.field_2._8_8_ = in_stack_fffffffffffff230;
  TestArgsManager::ReadConfigString(&test_args,str_config_02);
  std::__cxx11::string::~string(local_468);
  local_a68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_a60 = "";
  local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a70 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar4;
  msg_22.m_begin = pvVar3;
  file_22.m_end = (iterator)0x2b9;
  file_22.m_begin = (iterator)&local_a68;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_a78,
             msg_22);
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_01139f30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_a88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_a80 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  pcVar9 = "\"test\"";
  pcVar8 = "test";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_3a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_388,&local_a88,0x2b9,1,2,psVar5,0xb54254);
  std::__cxx11::string::~string((string *)&local_3a8);
  local_a98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_a90 = "";
  local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_aa0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = (iterator)psVar5;
  msg_23.m_begin = pvVar3;
  file_23.m_end = (iterator)0x2bb;
  file_23.m_begin = (iterator)&local_a98;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_aa8,
             msg_23);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,3,argv_both,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(3, argv_both, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_ab8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_ab0 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_ab8,699);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            (local_488,"testnet=1\nregtest=0\n[test]\nregtest=1",(allocator<char> *)local_388);
  str_config_03._M_dataplus._M_p._4_4_ = uVar7;
  str_config_03._M_dataplus._M_p._0_4_ = uVar6;
  str_config_03._M_string_length = (size_type)pcVar8;
  str_config_03.field_2._M_allocated_capacity = (size_type)pcVar9;
  str_config_03.field_2._8_8_ = in_stack_fffffffffffff230;
  TestArgsManager::ReadConfigString(&test_args,str_config_03);
  std::__cxx11::string::~string(local_488);
  local_ac8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_ac0 = "";
  local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = pvVar4;
  msg_24.m_begin = pvVar3;
  file_24.m_end = (iterator)0x2bd;
  file_24.m_begin = (iterator)&local_ac8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_ad8,
             msg_24);
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_4a8,&test_args.super_ArgsManager);
  std::__cxx11::string::~string((string *)&local_4a8);
  local_ae8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_ae0 = "";
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = pvVar4;
  msg_25.m_begin = pvVar3;
  file_25.m_end = (iterator)0x2bd;
  file_25.m_begin = (iterator)&local_ae8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_af8,
             msg_25);
  local_3a8._M_dataplus._M_p._0_1_ = 0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a848;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "exception std::runtime_error expected but not raised";
  local_b08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_b00 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,1,WARN,(check_type)pcVar8,
             (size_t)&local_b08,0x2bd);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_388,"test",(allocator<char> *)&local_3a8);
  ArgsManager::SelectConfigNetwork(&test_args.super_ArgsManager,(string *)local_388);
  std::__cxx11::string::~string((string *)local_388);
  local_b48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_b40 = "";
  local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = pvVar4;
  msg_26.m_begin = pvVar3;
  file_26.m_end = (iterator)0x2c3;
  file_26.m_begin = (iterator)&local_b48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_b58,
             msg_26);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,0,argv_testnet,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(0, argv_testnet, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_b68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_b60 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_b68,0x2c3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4c8,"testnet=1\nregtest=0\n[test]\nregtest=1",(allocator<char> *)local_388);
  str_config_04._M_dataplus._M_p._4_4_ = uVar7;
  str_config_04._M_dataplus._M_p._0_4_ = uVar6;
  str_config_04._M_string_length = (size_type)pcVar8;
  str_config_04.field_2._M_allocated_capacity = (size_type)pcVar9;
  str_config_04.field_2._8_8_ = in_stack_fffffffffffff230;
  TestArgsManager::ReadConfigString(&test_args,str_config_04);
  std::__cxx11::string::~string(local_4c8);
  local_b78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_b70 = "";
  local_b88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b80 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = pvVar4;
  msg_27.m_begin = pvVar3;
  file_27.m_end = (iterator)0x2c5;
  file_27.m_begin = (iterator)&local_b78;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_b88,
             msg_27);
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_01139f30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_b98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_b90 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  pcVar9 = "\"test\"";
  pcVar8 = "test";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_3a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_388,&local_b98,0x2c5,1,2,psVar5,0xb54254);
  std::__cxx11::string::~string((string *)&local_3a8);
  local_ba8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_ba0 = "";
  local_bb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bb0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = (iterator)psVar5;
  msg_28.m_begin = pvVar3;
  file_28.m_end = (iterator)0x2c7;
  file_28.m_begin = (iterator)&local_ba8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_bb8,
             msg_28);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_testnet,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(2, argv_testnet, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_bc8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_bc0 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_bc8,0x2c7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4e8,"testnet=1\nregtest=0\n[test]\nregtest=1",(allocator<char> *)local_388);
  str_config_05._M_dataplus._M_p._4_4_ = uVar7;
  str_config_05._M_dataplus._M_p._0_4_ = uVar6;
  str_config_05._M_string_length = (size_type)pcVar8;
  str_config_05.field_2._M_allocated_capacity = (size_type)pcVar9;
  str_config_05.field_2._8_8_ = in_stack_fffffffffffff230;
  TestArgsManager::ReadConfigString(&test_args,str_config_05);
  std::__cxx11::string::~string(local_4e8);
  local_bd8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_bd0 = "";
  local_be8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_be0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_29.m_end = pvVar4;
  msg_29.m_begin = pvVar3;
  file_29.m_end = (iterator)0x2c9;
  file_29.m_begin = (iterator)&local_bd8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_be8,
             msg_29);
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_01139f30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_bf8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_bf0 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  pcVar9 = "\"test\"";
  pcVar8 = "test";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_3a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_388,&local_bf8,0x2c9,1,2,psVar5,0xb54254);
  std::__cxx11::string::~string((string *)&local_3a8);
  local_c08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_c00 = "";
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_30.m_end = (iterator)psVar5;
  msg_30.m_begin = pvVar3;
  file_30.m_end = (iterator)0x2cb;
  file_30.m_begin = (iterator)&local_c08;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_c18,
             msg_30);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_regtest,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(2, argv_regtest, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_c28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_c20 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_c28,0x2cb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            (local_508,"testnet=1\nregtest=0\n[test]\nregtest=1",(allocator<char> *)local_388);
  str_config_06._M_dataplus._M_p._4_4_ = uVar7;
  str_config_06._M_dataplus._M_p._0_4_ = uVar6;
  str_config_06._M_string_length = (size_type)pcVar8;
  str_config_06.field_2._M_allocated_capacity = (size_type)pcVar9;
  str_config_06.field_2._8_8_ = in_stack_fffffffffffff230;
  TestArgsManager::ReadConfigString(&test_args,str_config_06);
  std::__cxx11::string::~string(local_508);
  local_c38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_c30 = "";
  local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c40 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_31.m_end = pvVar4;
  msg_31.m_begin = pvVar3;
  file_31.m_end = (iterator)0x2cd;
  file_31.m_begin = (iterator)&local_c38;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_c48,
             msg_31);
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_528,&test_args.super_ArgsManager);
  std::__cxx11::string::~string((string *)&local_528);
  local_c58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_c50 = "";
  local_c68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c60 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_32.m_end = pvVar4;
  msg_32.m_begin = pvVar3;
  file_32.m_end = (iterator)0x2cd;
  file_32.m_begin = (iterator)&local_c58;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_c68,
             msg_32);
  local_3a8._M_dataplus._M_p._0_1_ = 0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a848;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "exception std::runtime_error expected but not raised";
  local_c78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_c70 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,1,WARN,(check_type)pcVar8,
             (size_t)&local_c78,0x2cd);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  local_cb8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_cb0 = "";
  local_cc8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cc0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_33.m_end = pvVar4;
  msg_33.m_begin = pvVar3;
  file_33.m_end = (iterator)0x2cf;
  file_33.m_begin = (iterator)&local_cb8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_cc8,
             msg_33);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_test_no_reg,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(2, argv_test_no_reg, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_cd8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_cd0 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_cd8,0x2cf);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            (local_548,"testnet=1\nregtest=0\n[test]\nregtest=1",(allocator<char> *)local_388);
  str_config_07._M_dataplus._M_p._4_4_ = uVar7;
  str_config_07._M_dataplus._M_p._0_4_ = uVar6;
  str_config_07._M_string_length = (size_type)pcVar8;
  str_config_07.field_2._M_allocated_capacity = (size_type)pcVar9;
  str_config_07.field_2._8_8_ = in_stack_fffffffffffff230;
  TestArgsManager::ReadConfigString(&test_args,str_config_07);
  std::__cxx11::string::~string(local_548);
  local_ce8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_ce0 = "";
  local_cf8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cf0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_34.m_end = pvVar4;
  msg_34.m_begin = pvVar3;
  file_34.m_end = (iterator)0x2d1;
  file_34.m_begin = (iterator)&local_ce8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_cf8,
             msg_34);
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_01139f30;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_d08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_d00 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  pcVar9 = "\"test\"";
  pcVar8 = "test";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_3a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (local_388,&local_d08,0x2d1,1,2,psVar5,0xb54254);
  std::__cxx11::string::~string((string *)&local_3a8);
  local_d18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_d10 = "";
  local_d28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d20 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_35.m_end = (iterator)psVar5;
  msg_35.m_begin = pvVar3;
  file_35.m_end = (iterator)0x2d3;
  file_35.m_begin = (iterator)&local_d18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_d28,
             msg_35);
  local_3a8._M_dataplus._M_p._0_1_ =
       ArgsManager::ParseParameters(&test_args.super_ArgsManager,3,argv_both,&error);
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_5e8 = "test_args.ParseParameters(3, argv_both, error)";
  local_5e0 = "";
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a070;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = (char *)&local_5e8;
  local_d38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_d30 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,0,WARN,(check_type)pcVar8,
             (size_t)&local_d38,0x2d3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            (local_568,"testnet=1\nregtest=0\n[test]\nregtest=1",(allocator<char> *)local_388);
  str_config_08._M_dataplus._M_p._4_4_ = uVar7;
  str_config_08._M_dataplus._M_p._0_4_ = uVar6;
  str_config_08._M_string_length = (size_type)pcVar8;
  str_config_08.field_2._M_allocated_capacity = (size_type)pcVar9;
  str_config_08.field_2._8_8_ = in_stack_fffffffffffff230;
  TestArgsManager::ReadConfigString(&test_args,str_config_08);
  std::__cxx11::string::~string(local_568);
  local_d48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_d40 = "";
  local_d58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_36.m_end = pvVar4;
  msg_36.m_begin = pvVar3;
  file_36.m_end = (iterator)0x2d5;
  file_36.m_begin = (iterator)&local_d48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_d58,
             msg_36);
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_588,&test_args.super_ArgsManager);
  std::__cxx11::string::~string((string *)&local_588);
  local_d68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_d60 = "";
  local_d78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_37.m_end = pvVar4;
  msg_37.m_begin = pvVar3;
  file_37.m_end = (iterator)0x2d5;
  file_37.m_begin = (iterator)&local_d68;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_d78,
             msg_37);
  local_3a8._M_dataplus._M_p._0_1_ = 0;
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_allocated_capacity = 0;
  local_388[8] = false;
  local_388._0_8_ = &PTR__lazy_ostream_0113a848;
  local_378 = boost::unit_test::lazy_ostream::inst;
  local_370 = "exception std::runtime_error expected but not raised";
  local_d88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_d80 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,1,WARN,(check_type)pcVar8,
             (size_t)&local_d88,0x2d5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3a8.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&error);
  ArgsManager::~ArgsManager(&test_args.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_GetChainTypeString)
{
    TestArgsManager test_args;
    const auto testnet = std::make_pair("-testnet", ArgsManager::ALLOW_ANY);
    const auto testnet4 = std::make_pair("-testnet4", ArgsManager::ALLOW_ANY);
    const auto regtest = std::make_pair("-regtest", ArgsManager::ALLOW_ANY);
    test_args.SetupArgs({testnet, testnet4, regtest});

    const char* argv_testnet[] = {"cmd", "-testnet"};
    const char* argv_testnet4[] = {"cmd", "-testnet4"};
    const char* argv_regtest[] = {"cmd", "-regtest"};
    const char* argv_test_no_reg[] = {"cmd", "-testnet", "-noregtest"};
    const char* argv_both[] = {"cmd", "-testnet", "-regtest"};

    // equivalent to "-testnet"
    // regtest in testnet section is ignored
    const char* testnetconf = "testnet=1\nregtest=0\n[test]\nregtest=1";
    std::string error;

    BOOST_CHECK(test_args.ParseParameters(0, argv_testnet, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "main");

    BOOST_CHECK(test_args.ParseParameters(2, argv_testnet, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(0, argv_testnet4, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "main");

    BOOST_CHECK(test_args.ParseParameters(2, argv_testnet4, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "testnet4");

    BOOST_CHECK(test_args.ParseParameters(2, argv_regtest, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "regtest");

    BOOST_CHECK(test_args.ParseParameters(3, argv_test_no_reg, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(3, argv_both, error));
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);

    BOOST_CHECK(test_args.ParseParameters(0, argv_testnet, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(2, argv_testnet, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(2, argv_regtest, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);

    BOOST_CHECK(test_args.ParseParameters(3, argv_test_no_reg, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(3, argv_both, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);

    // check setting the network to test (and thus making
    // [test] regtest=1 potentially relevant) doesn't break things
    test_args.SelectConfigNetwork("test");

    BOOST_CHECK(test_args.ParseParameters(0, argv_testnet, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(2, argv_testnet, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(2, argv_regtest, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);

    BOOST_CHECK(test_args.ParseParameters(2, argv_test_no_reg, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(3, argv_both, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);
}